

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit_document_end(yaml_emitter_t *emitter,yaml_event_t *event)

{
  yaml_tag_directive_t *pyVar1;
  yaml_char_t *ptr;
  int iVar2;
  yaml_tag_directive_t tag_directive;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  if (event->type == YAML_DOCUMENT_END_EVENT) {
    iVar2 = yaml_emitter_write_indent(emitter);
    if (iVar2 == 0) {
      emitter_local._4_4_ = 0;
    }
    else {
      if ((event->data).stream_start.encoding == YAML_ANY_ENCODING) {
        iVar2 = yaml_emitter_write_indicator(emitter,"...",1,0,0);
        if (iVar2 == 0) {
          return 0;
        }
        iVar2 = yaml_emitter_write_indent(emitter);
        if (iVar2 == 0) {
          return 0;
        }
      }
      iVar2 = yaml_emitter_flush(emitter);
      if (iVar2 == 0) {
        emitter_local._4_4_ = 0;
      }
      else {
        emitter->state = YAML_EMIT_DOCUMENT_START_STATE;
        while ((emitter->tag_directives).start != (emitter->tag_directives).top) {
          pyVar1 = (emitter->tag_directives).top;
          (emitter->tag_directives).top = pyVar1 + -1;
          ptr = pyVar1[-1].prefix;
          yaml_free(pyVar1[-1].handle);
          yaml_free(ptr);
        }
        emitter_local._4_4_ = 1;
      }
    }
  }
  else {
    emitter_local._4_4_ = yaml_emitter_set_emitter_error(emitter,"expected DOCUMENT-END");
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_emit_document_end(yaml_emitter_t *emitter,
        yaml_event_t *event)
{
    if (event->type == YAML_DOCUMENT_END_EVENT)
    {
        if (!yaml_emitter_write_indent(emitter))
            return 0;
        if (!event->data.document_end.implicit) {
            if (!yaml_emitter_write_indicator(emitter, "...", 1, 0, 0))
                return 0;
            if (!yaml_emitter_write_indent(emitter))
                return 0;
        }
        if (!yaml_emitter_flush(emitter))
            return 0;

        emitter->state = YAML_EMIT_DOCUMENT_START_STATE;

        while (!STACK_EMPTY(emitter, emitter->tag_directives)) {
            yaml_tag_directive_t tag_directive = POP(emitter,
                    emitter->tag_directives);
            yaml_free(tag_directive.handle);
            yaml_free(tag_directive.prefix);
        }

        return 1;
    }

    return yaml_emitter_set_emitter_error(emitter,
            "expected DOCUMENT-END");
}